

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void heapify(VecPNode *a,uint i)

{
  PNode *pPVar1;
  uint uVar2;
  uint uVar3;
  PNode *temp;
  uint r;
  uint l;
  uint largest;
  uint i_local;
  VecPNode *a_local;
  
  if (a->n != 0) {
    uVar2 = i * 2 + 1;
    uVar3 = i * 2 + 2;
    r = i;
    if ((uVar2 < a->n) && (r = i, a->v[i]->height < a->v[uVar2]->height)) {
      r = uVar2;
    }
    if ((uVar3 < a->n) && (a->v[r]->height < a->v[uVar3]->height)) {
      r = uVar3;
    }
    if (r != i) {
      pPVar1 = a->v[r];
      a->v[r] = a->v[i];
      a->v[i] = pPVar1;
      heapify(a,r);
    }
  }
  return;
}

Assistant:

void heapify(VecPNode *a, uint i) {
  if (a->n >= 1) {
    uint largest = i;
    uint l = 2 * i + 1;
    uint r = 2 * i + 2;
    if (l < a->n && a->v[l]->height > a->v[largest]->height)
      largest = l;
    if (r < a->n && a->v[r]->height > a->v[largest]->height)
      largest = r;
    if (largest != i) {
      PNode *temp = a->v[largest];
      a->v[largest] = a->v[i];
      a->v[i] = temp;
      heapify(a, largest);
    }
  }
}